

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O2

ptrdiff_t rcnb_decode_block(wchar_t *code_in,size_t length_in,char *plaintext_out,
                           rcnb_decodestate *state_in)

{
  wchar_t wVar1;
  size_t sVar2;
  _Bool _Var3;
  ptrdiff_t pVar4;
  size_t sVar5;
  ulong uVar6;
  wchar_t *value_in;
  wchar_t *pwVar7;
  size_t sVar8;
  ulong uVar9;
  char *plaintext_char;
  char *local_48;
  wchar_t *local_40;
  ulong local_38;
  
  sVar2 = state_in->i;
  local_40 = state_in->trailing_code;
  pwVar7 = code_in;
  sVar8 = length_in;
  for (sVar5 = 0; (sVar2 + sVar5 < 4 && (length_in != sVar5)); sVar5 = sVar5 + 1) {
    wVar1 = code_in[sVar5];
    state_in->i = sVar2 + sVar5 + 1;
    state_in->trailing_code[sVar2 + sVar5] = wVar1;
    sVar8 = sVar8 - 1;
    pwVar7 = pwVar7 + 1;
  }
  uVar6 = length_in - sVar5;
  if (uVar6 == 0) {
    pVar4 = 0;
  }
  else {
    plaintext_char = plaintext_out;
    _Var3 = rcnb_decode_short(local_40,&plaintext_char);
    if (_Var3) {
      state_in->i = 0;
      local_38 = uVar6 >> 2;
      uVar9 = 0xffffffffffffffff;
      value_in = pwVar7;
      local_48 = plaintext_out;
      do {
        uVar9 = uVar9 + 1;
        if (local_38 <= uVar9) {
          uVar9 = (ulong)((uint)uVar6 & 3);
          state_in->i = uVar9;
          for (uVar6 = 0; uVar6 < uVar9; uVar6 = uVar6 + 1) {
            local_40[uVar6] = pwVar7[(sVar8 & 0xfffffffffffffffc) + uVar6];
          }
          *plaintext_char = '\0';
          return (long)plaintext_char - (long)local_48;
        }
        _Var3 = rcnb_decode_short(value_in,&plaintext_char);
        value_in = value_in + 4;
      } while (_Var3);
    }
    pVar4 = -1;
  }
  return pVar4;
}

Assistant:

ptrdiff_t rcnb_decode_block(const wchar_t* code_in, size_t length_in,
        char* const plaintext_out, rcnb_decodestate* state_in)
{
    char* plaintext_char = plaintext_out;
    bool res;
    while (state_in->i < 4 && length_in > 0) {
        state_in->trailing_code[state_in->i++] = code_in[0];
        length_in--;
        code_in++;
    }
    if (length_in == 0)
        return 0;
    res = rcnb_decode_short(state_in->trailing_code, &plaintext_char);
    if (!res)
        return -1;
    state_in->i = 0;
#if defined(ENABLE_AVX2) || defined(ENABLE_SSSE3) || defined(ENABLE_NEON)
    size_t batch = length_in >> 6;
    if (batch > 0) {
        res = rcnb_decode_32n_asm((const char *)code_in, plaintext_char, batch);
        if (!res)
            return -1;
    }
    plaintext_char += 32 * batch;
    code_in += 64 * batch;
    length_in = length_in & 63;
#endif
    for (int i = 0; i < (length_in >> 2); ++i) {
        res = rcnb_decode_short(code_in + i * 4, &plaintext_char);
        if (!res)
            return -1;
    }
    state_in->i = length_in % 4;
    for (size_t j = 0; j < state_in->i; ++j) {
        state_in->trailing_code[j] = code_in[length_in - state_in->i + j];
    }
    *plaintext_char = 0;
    return plaintext_char - plaintext_out;
}